

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::ParseGoogleTestFlagsOnlyImpl<char>(int *argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char **in_RDX;
  char **extraout_RDX;
  char **extraout_RDX_00;
  char **extraout_RDX_01;
  char **extraout_RDX_02;
  char **extraout_RDX_03;
  char **extraout_RDX_04;
  char **extraout_RDX_05;
  char **extraout_RDX_06;
  long lVar3;
  _Alloc_hider _Var4;
  int iVar5;
  string arg_string;
  string local_50;
  
  _Var4._M_p = (pointer)argc;
  if (1 < *argc) {
    iVar5 = 1;
    do {
      StreamableToString<char*>(&local_50,(internal *)(argv + iVar5),in_RDX);
      _Var4._M_p = local_50._M_dataplus._M_p;
      bVar1 = ParseGoogleTestFlag(local_50._M_dataplus._M_p);
      in_RDX = extraout_RDX;
      if (bVar1) {
LAB_00126789:
        iVar2 = *argc;
        if (iVar2 != iVar5) {
          in_RDX = argv + (long)iVar5 + 1;
          lVar3 = 0;
          do {
            in_RDX[lVar3 + -1] = in_RDX[lVar3];
            lVar3 = lVar3 + 1;
          } while (iVar2 - iVar5 != (int)lVar3);
        }
        *argc = iVar2 + -1;
        iVar5 = iVar5 + -1;
      }
      else {
        bVar1 = ParseStringFlag<std::__cxx11::string>
                          (_Var4._M_p,"flagfile",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &FLAGS_gtest_flagfile_abi_cxx11_);
        if (bVar1) {
          LoadFlagsFromFile((string *)_Var4._M_p);
          in_RDX = extraout_RDX_00;
          goto LAB_00126789;
        }
        iVar2 = std::__cxx11::string::compare((char *)&local_50);
        in_RDX = extraout_RDX_01;
        if (iVar2 == 0) {
LAB_0012680f:
          g_help_flag = '\x01';
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)&local_50);
          in_RDX = extraout_RDX_02;
          if (iVar2 == 0) goto LAB_0012680f;
          iVar2 = std::__cxx11::string::compare((char *)&local_50);
          in_RDX = extraout_RDX_03;
          if (iVar2 == 0) goto LAB_0012680f;
          iVar2 = std::__cxx11::string::compare((char *)&local_50);
          in_RDX = extraout_RDX_04;
          if (iVar2 == 0) goto LAB_0012680f;
          bVar1 = HasGoogleTestFlagPrefix((char *)0x12680b);
          in_RDX = extraout_RDX_05;
          if (bVar1) goto LAB_0012680f;
        }
      }
      _Var4._M_p = local_50._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        in_RDX = extraout_RDX_06;
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < *argc);
  }
  if (g_help_flag != '\0') {
    PrintColorEncoded(_Var4._M_p);
  }
  return;
}

Assistant:

void ParseGoogleTestFlagsOnlyImpl(int* argc, CharType** argv) {
  for (int i = 1; i < *argc; i++) {
    const std::string arg_string = StreamableToString(argv[i]);
    const char* const arg = arg_string.c_str();

    using internal::ParseBoolFlag;
    using internal::ParseInt32Flag;
    using internal::ParseStringFlag;

    bool remove_flag = false;
    if (ParseGoogleTestFlag(arg)) {
      remove_flag = true;
#if GTEST_USE_OWN_FLAGFILE_FLAG_
    } else if (ParseStringFlag(arg, kFlagfileFlag, &GTEST_FLAG(flagfile))) {
      LoadFlagsFromFile(GTEST_FLAG(flagfile));
      remove_flag = true;
#endif  // GTEST_USE_OWN_FLAGFILE_FLAG_
    } else if (arg_string == "--help" || arg_string == "-h" ||
               arg_string == "-?" || arg_string == "/?" ||
               HasGoogleTestFlagPrefix(arg)) {
      // Both help flag and unrecognized Google Test flags (excluding
      // internal ones) trigger help display.
      g_help_flag = true;
    }

    if (remove_flag) {
      // Shift the remainder of the argv list left by one.  Note
      // that argv has (*argc + 1) elements, the last one always being
      // NULL.  The following loop moves the trailing NULL element as
      // well.
      for (int j = i; j != *argc; j++) {
        argv[j] = argv[j + 1];
      }

      // Decrements the argument count.
      (*argc)--;

      // We also need to decrement the iterator as we just removed
      // an element.
      i--;
    }
  }

  if (g_help_flag) {
    // We print the help here instead of in RUN_ALL_TESTS(), as the
    // latter may not be called at all if the user is using Google
    // Test with another testing framework.
    PrintColorEncoded(kColorEncodedHelpMessage);
  }
}